

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O3

int Nwk_ManRetimeVerifyCutForward(Nwk_Man_t *pMan,Vec_Ptr_t *vNodes)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  
  if (0 < vNodes->nSize) {
    lVar4 = 0;
    do {
      uVar2 = *(uint *)((long)vNodes->pArray[lVar4] + 0x20);
      if ((uVar2 & 0x10) != 0) {
        __assert_fail("pObj->MarkA == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFlow.c"
                      ,0x191,"int Nwk_ManRetimeVerifyCutForward(Nwk_Man_t *, Vec_Ptr_t *)");
      }
      *(uint *)((long)vNodes->pArray[lVar4] + 0x20) = uVar2 | 0x10;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vNodes->nSize);
  }
  Nwk_ManIncrementTravId(pMan);
  pVVar5 = pMan->vCos;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      iVar3 = Nwk_ManVerifyCut_rec((Nwk_Obj_t *)pVVar5->pArray[lVar4]);
      if (iVar3 == 0) {
        puts("Nwk_ManRetimeVerifyCutForward(): Internal cut verification failed.");
      }
      lVar4 = lVar4 + 1;
      pVVar5 = pMan->vCos;
    } while (lVar4 < pVVar5->nSize);
  }
  if (0 < vNodes->nSize) {
    lVar4 = 0;
    do {
      puVar1 = (uint *)((long)vNodes->pArray[lVar4] + 0x20);
      *puVar1 = *puVar1 & 0xffffffef;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vNodes->nSize);
  }
  return 1;
}

Assistant:

int Nwk_ManRetimeVerifyCutForward( Nwk_Man_t * pMan, Vec_Ptr_t * vNodes )
{
    Nwk_Obj_t * pObj;
    int i;
    // mark the nodes
    Vec_PtrForEachEntry( Nwk_Obj_t *, vNodes, pObj, i )
    {
        assert( pObj->MarkA == 0 );
        pObj->MarkA = 1;
    }
    // traverse from the COs
    Nwk_ManIncrementTravId( pMan );
    Nwk_ManForEachCo( pMan, pObj, i )
        if ( !Nwk_ManVerifyCut_rec( pObj ) )
            printf( "Nwk_ManRetimeVerifyCutForward(): Internal cut verification failed.\n" );
    // unmark the nodes
    Vec_PtrForEachEntry( Nwk_Obj_t *, vNodes, pObj, i )
        pObj->MarkA = 0;
    return 1;
}